

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
AddMember(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *name,
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *value,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  Number *pNVar1;
  uint uVar2;
  Number NVar3;
  uint uVar4;
  void *pvVar5;
  Ch *pCVar6;
  
  if ((this->data_).f.flags != 3) {
    __assert_fail("IsObject()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                  ,0x4da,
                  "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::AddMember(GenericValue<Encoding, Allocator> &, GenericValue<Encoding, Allocator> &, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                 );
  }
  if ((undefined1  [16])((undefined1  [16])name->data_ & (undefined1  [16])0x400000000000000) !=
      (undefined1  [16])0x0) {
    uVar2 = (this->data_).s.hashcode;
    if ((this->data_).s.length < uVar2) {
      pCVar6 = (this->data_).s.str;
    }
    else {
      if ((ulong)uVar2 == 0) {
        (this->data_).s.hashcode = 0x10;
        pvVar5 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc(allocator,0x200);
      }
      else {
        uVar4 = (uVar2 + 1 >> 1) + uVar2;
        (this->data_).s.hashcode = uVar4;
        pvVar5 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Realloc
                           (allocator,(void *)((ulong)(this->data_).s.str & 0xffffffffffff),
                            (ulong)uVar2 << 5,(ulong)uVar4 << 5);
      }
      pCVar6 = (Ch *)((ulong)(this->data_).s.str & 0xffff000000000000 | (ulong)pvVar5);
      (this->data_).s.str = pCVar6;
    }
    NVar3 = (Number)(name->data_).s.str;
    pNVar1 = (Number *)(((ulong)pCVar6 & 0xffffffffffff) + (ulong)(this->data_).s.length * 0x20);
    *pNVar1 = (name->data_).n;
    pNVar1[1] = NVar3;
    (name->data_).f.flags = 0;
    NVar3 = (Number)(value->data_).s.str;
    pNVar1 = (Number *)
             (((ulong)pCVar6 & 0xffffffffffff) + 0x10 + (ulong)(this->data_).s.length * 0x20);
    *pNVar1 = (value->data_).n;
    pNVar1[1] = NVar3;
    (value->data_).f.flags = 0;
    (this->data_).s.length = (this->data_).s.length + 1;
    return this;
  }
  __assert_fail("name.IsString()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/../contrib/rapidjson/include/rapidjson/document.h"
                ,0x4db,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::AddMember(GenericValue<Encoding, Allocator> &, GenericValue<Encoding, Allocator> &, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool IsObject() const { return data_.f.flags == kObjectFlag; }